

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void fl_text_drag_me(int pos,Fl_Text_Display *d)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Fl_Text_Buffer *pFVar4;
  Fl_Text_Buffer *pFVar5;
  Fl_Text_Display *pFVar6;
  fd_set *in_R8;
  timeval *in_R9;
  Fl_Text_Display *d_local;
  int pos_local;
  
  if (d->dragType == 0) {
    if (pos < d->dragPos) {
      pFVar6 = d;
      pFVar4 = Fl_Text_Display::buffer(d);
      Fl_Text_Buffer::select
                (pFVar4,pos,(fd_set *)(ulong)(uint)d->dragPos,(fd_set *)pFVar6,in_R8,in_R9);
    }
    else {
      pFVar6 = d;
      pFVar4 = Fl_Text_Display::buffer(d);
      Fl_Text_Buffer::select
                (pFVar4,d->dragPos,(fd_set *)(ulong)(uint)pos,(fd_set *)pFVar6,in_R8,in_R9);
    }
    Fl_Text_Display::insert_position(d,pos);
  }
  else if (d->dragType == 1) {
    if (pos < d->dragPos) {
      pFVar6 = d;
      iVar1 = Fl_Text_Display::word_start(d,pos);
      Fl_Text_Display::insert_position(d,iVar1);
      pFVar4 = Fl_Text_Display::buffer(d);
      iVar1 = Fl_Text_Display::word_start(d,pos);
      uVar2 = Fl_Text_Display::word_end(d,d->dragPos);
      Fl_Text_Buffer::select(pFVar4,iVar1,(fd_set *)(ulong)uVar2,(fd_set *)pFVar6,in_R8,in_R9);
    }
    else {
      pFVar6 = d;
      iVar1 = Fl_Text_Display::word_end(d,pos);
      Fl_Text_Display::insert_position(d,iVar1);
      pFVar4 = Fl_Text_Display::buffer(d);
      iVar1 = Fl_Text_Display::word_start(d,d->dragPos);
      uVar2 = Fl_Text_Display::word_end(d,pos);
      Fl_Text_Buffer::select(pFVar4,iVar1,(fd_set *)(ulong)uVar2,(fd_set *)pFVar6,in_R8,in_R9);
    }
  }
  else if (d->dragType == 2) {
    if (pos < d->dragPos) {
      pFVar6 = d;
      pFVar4 = Fl_Text_Display::buffer(d);
      iVar1 = Fl_Text_Buffer::line_start(pFVar4,pos);
      Fl_Text_Display::insert_position(d,iVar1);
      pFVar4 = Fl_Text_Display::buffer(d);
      pFVar5 = Fl_Text_Display::buffer(d);
      iVar1 = Fl_Text_Buffer::line_start(pFVar5,pos);
      pFVar5 = Fl_Text_Display::buffer(d);
      iVar3 = Fl_Text_Buffer::line_end(pFVar5,d->dragPos);
      Fl_Text_Buffer::select(pFVar4,iVar1,(fd_set *)(ulong)(iVar3 + 1),(fd_set *)pFVar6,in_R8,in_R9)
      ;
    }
    else {
      pFVar6 = d;
      pFVar4 = Fl_Text_Display::buffer(d);
      iVar1 = Fl_Text_Buffer::line_end(pFVar4,pos);
      Fl_Text_Display::insert_position(d,iVar1 + 1);
      pFVar4 = Fl_Text_Display::buffer(d);
      pFVar5 = Fl_Text_Display::buffer(d);
      iVar1 = Fl_Text_Buffer::line_start(pFVar5,d->dragPos);
      pFVar5 = Fl_Text_Display::buffer(d);
      iVar3 = Fl_Text_Buffer::line_end(pFVar5,pos);
      Fl_Text_Buffer::select(pFVar4,iVar1,(fd_set *)(ulong)(iVar3 + 1),(fd_set *)pFVar6,in_R8,in_R9)
      ;
    }
  }
  return;
}

Assistant:

void fl_text_drag_me(int pos, Fl_Text_Display* d) {
  if (d->dragType == Fl_Text_Display::DRAG_CHAR) {
    if (pos >= d->dragPos) {
      d->buffer()->select(d->dragPos, pos);
    } else {
      d->buffer()->select(pos, d->dragPos);
    }
    d->insert_position(pos);
  } else if (d->dragType == Fl_Text_Display::DRAG_WORD) {
    if (pos >= d->dragPos) {
      d->insert_position(d->word_end(pos));
      d->buffer()->select(d->word_start(d->dragPos), d->word_end(pos));
    } else {
      d->insert_position(d->word_start(pos));
      d->buffer()->select(d->word_start(pos), d->word_end(d->dragPos));
    }
  } else if (d->dragType == Fl_Text_Display::DRAG_LINE) {
    if (pos >= d->dragPos) {
      d->insert_position(d->buffer()->line_end(pos)+1);
      d->buffer()->select(d->buffer()->line_start(d->dragPos),
                          d->buffer()->line_end(pos)+1);
    } else {
      d->insert_position(d->buffer()->line_start(pos));
      d->buffer()->select(d->buffer()->line_start(pos),
                          d->buffer()->line_end(d->dragPos)+1);
    }
  }
}